

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O2

__m128i convolve_hi_y_12tap(__m128i *s,__m128i *coeffs)

{
  __m128i alVar1;
  __m128i ss [6];
  __m128i local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_68[0] = (ulong)CONCAT16(*(undefined1 *)((long)*s + 0xb),
                                (uint6)CONCAT14(*(undefined1 *)((long)*s + 10),
                                                (uint)CONCAT12(*(undefined1 *)((long)*s + 9),
                                                               (ushort)(byte)(*s)[1])));
  local_68[1]._0_1_ = *(undefined1 *)((long)*s + 0xc);
  local_68[1]._1_1_ = 0;
  local_68[1]._2_1_ = *(undefined1 *)((long)*s + 0xd);
  local_68[1]._3_1_ = 0;
  local_68[1]._4_1_ = *(undefined1 *)((long)*s + 0xe);
  local_68[1]._5_1_ = 0;
  local_68[1]._6_1_ = *(undefined1 *)((long)*s + 0xf);
  local_68[1]._7_1_ = 0;
  local_58[1] = 0;
  local_58[0] = (byte)s[2][1];
  local_58[2] = *(undefined1 *)((long)s[2] + 9);
  local_58[3] = 0;
  local_58[4] = *(undefined1 *)((long)s[2] + 10);
  local_58[5] = 0;
  local_58[6] = *(undefined1 *)((long)s[2] + 0xb);
  local_58[7] = 0;
  local_58[8] = *(undefined1 *)((long)s[2] + 0xc);
  local_58[9] = 0;
  local_58[10] = *(undefined1 *)((long)s[2] + 0xd);
  local_58[0xb] = 0;
  local_58[0xc] = *(undefined1 *)((long)s[2] + 0xe);
  local_58[0xd] = 0;
  local_58[0xe] = *(undefined1 *)((long)s[2] + 0xf);
  local_58[0xf] = 0;
  local_48[1] = 0;
  local_48[0] = (byte)s[4][1];
  local_48[2] = *(undefined1 *)((long)s[4] + 9);
  local_48[3] = 0;
  local_48[4] = *(undefined1 *)((long)s[4] + 10);
  local_48[5] = 0;
  local_48[6] = *(undefined1 *)((long)s[4] + 0xb);
  local_48[7] = 0;
  local_48[8] = *(undefined1 *)((long)s[4] + 0xc);
  local_48[9] = 0;
  local_48[10] = *(undefined1 *)((long)s[4] + 0xd);
  local_48[0xb] = 0;
  local_48[0xc] = *(undefined1 *)((long)s[4] + 0xe);
  local_48[0xd] = 0;
  local_48[0xe] = *(undefined1 *)((long)s[4] + 0xf);
  local_48[0xf] = 0;
  local_38[1] = 0;
  local_38[0] = (byte)s[6][1];
  local_38[2] = *(undefined1 *)((long)s[6] + 9);
  local_38[3] = 0;
  local_38[4] = *(undefined1 *)((long)s[6] + 10);
  local_38[5] = 0;
  local_38[6] = *(undefined1 *)((long)s[6] + 0xb);
  local_38[7] = 0;
  local_38[8] = *(undefined1 *)((long)s[6] + 0xc);
  local_38[9] = 0;
  local_38[10] = *(undefined1 *)((long)s[6] + 0xd);
  local_38[0xb] = 0;
  local_38[0xc] = *(undefined1 *)((long)s[6] + 0xe);
  local_38[0xd] = 0;
  local_38[0xe] = *(undefined1 *)((long)s[6] + 0xf);
  local_38[0xf] = 0;
  local_28[1] = 0;
  local_28[0] = (byte)s[8][1];
  local_28[2] = *(undefined1 *)((long)s[8] + 9);
  local_28[3] = 0;
  local_28[4] = *(undefined1 *)((long)s[8] + 10);
  local_28[5] = 0;
  local_28[6] = *(undefined1 *)((long)s[8] + 0xb);
  local_28[7] = 0;
  local_28[8] = *(undefined1 *)((long)s[8] + 0xc);
  local_28[9] = 0;
  local_28[10] = *(undefined1 *)((long)s[8] + 0xd);
  local_28[0xb] = 0;
  local_28[0xc] = *(undefined1 *)((long)s[8] + 0xe);
  local_28[0xd] = 0;
  local_28[0xe] = *(undefined1 *)((long)s[8] + 0xf);
  local_28[0xf] = 0;
  local_18[1] = 0;
  local_18[0] = (byte)s[10][1];
  local_18[2] = *(undefined1 *)((long)s[10] + 9);
  local_18[3] = 0;
  local_18[4] = *(undefined1 *)((long)s[10] + 10);
  local_18[5] = 0;
  local_18[6] = *(undefined1 *)((long)s[10] + 0xb);
  local_18[7] = 0;
  local_18[8] = *(undefined1 *)((long)s[10] + 0xc);
  local_18[9] = 0;
  local_18[10] = *(undefined1 *)((long)s[10] + 0xd);
  local_18[0xb] = 0;
  local_18[0xc] = *(undefined1 *)((long)s[10] + 0xe);
  local_18[0xd] = 0;
  local_18[0xe] = *(undefined1 *)((long)s[10] + 0xf);
  local_18[0xf] = 0;
  alVar1 = convolve_12tap(&local_68,coeffs);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m128i convolve_hi_y_12tap(const __m128i *s,
                                          const __m128i *coeffs) {
  __m128i ss[6];
  const __m128i zero = _mm_setzero_si128();
  ss[0] = _mm_unpackhi_epi8(s[0], zero);
  ss[1] = _mm_unpackhi_epi8(s[2], zero);
  ss[2] = _mm_unpackhi_epi8(s[4], zero);
  ss[3] = _mm_unpackhi_epi8(s[6], zero);
  ss[4] = _mm_unpackhi_epi8(s[8], zero);
  ss[5] = _mm_unpackhi_epi8(s[10], zero);
  return convolve_12tap(ss, coeffs);
}